

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::GLES2ThreadedSharingTest::addImageOperations(GLES2ThreadedSharingTest *this)

{
  deInt32 *pdVar1;
  EGLThread *pEVar2;
  SharedPtrStateBase *pSVar3;
  pointer ppEVar4;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *pSVar5;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *pSVar6;
  Texture *pTVar7;
  int iVar8;
  InitGLExtension *pIVar9;
  CreateShader *pCVar10;
  ShaderSource *pSVar11;
  ShaderCompile *pSVar12;
  CreateProgram *this_00;
  AttachShader *pAVar13;
  LinkProgram *this_01;
  CreateTexture *pCVar14;
  TexImage2D *pTVar15;
  CreateImageFromTexture *pCVar16;
  DefineTextureFromImage *pDVar17;
  DeleteTexture *pDVar18;
  TexSubImage2D *pTVar19;
  CopyTexSubImage2D *pCVar20;
  CopyTexImage2D *pCVar21;
  RenderTexture *pRVar22;
  ReadPixels *pRVar23;
  CompareData *this_02;
  DestroyImage *pDVar24;
  DeleteShader *pDVar25;
  DeleteProgram *this_03;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> texture;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> program;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> image;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> sourceTexture;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> fragmentShader;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> vertexShader;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_2b8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_2a8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_298;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> local_288;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> local_278;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_268;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_258;
  SharedPtr<tcu::ThreadUtil::DataBlock> local_248;
  SharedPtr<tcu::ThreadUtil::DataBlock> local_238;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_228;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_218;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_208;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_1f8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_1e8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_1d8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_1c8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_1b8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_1a8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_198;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_188;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_178;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_168;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_158;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_148;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_138;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_128;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_118;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_108;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_f8;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> local_e8;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> local_d8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_c8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_b8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_a8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_98;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_88;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_78;
  SharedPtr<tcu::ThreadUtil::DataBlock> pixels2;
  SharedPtr<tcu::ThreadUtil::DataBlock> pixels1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_48;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_38;
  
  vertexShader.m_ptr = (Shader *)0x0;
  vertexShader.m_state = (SharedPtrStateBase *)0x0;
  fragmentShader.m_ptr = (Shader *)0x0;
  fragmentShader.m_state = (SharedPtrStateBase *)0x0;
  program.m_ptr = (Program *)0x0;
  program.m_state = (SharedPtrStateBase *)0x0;
  pEVar2 = *(this->m_threads).
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pIVar9 = (InitGLExtension *)operator_new(0x58);
  GLES2ThreadTest::InitGLExtension::InitGLExtension(pIVar9,"GL_OES_EGL_image");
  tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pIVar9);
  pEVar2 = (this->m_threads).
           super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
           ._M_impl.super__Vector_impl_data._M_start[1];
  pIVar9 = (InitGLExtension *)operator_new(0x58);
  GLES2ThreadTest::InitGLExtension::InitGLExtension(pIVar9,"GL_OES_EGL_image");
  tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pIVar9);
  if ((this->m_config).render == true) {
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar10 = (CreateShader *)operator_new(0x80);
    GLES2ThreadTest::CreateShader::CreateShader
              (pCVar10,0x8b31,&vertexShader,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pCVar10);
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar11 = (ShaderSource *)operator_new(0x98);
    local_1b8.m_ptr = vertexShader.m_ptr;
    local_1b8.m_state = vertexShader.m_state;
    if (vertexShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (vertexShader.m_state)->strongRefCount = (vertexShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (vertexShader.m_state)->weakRefCount = (vertexShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderSource::ShaderSource
              (pSVar11,&local_1b8,
               "attribute highp vec2 a_pos;\nvarying mediump vec2 v_pos;\nvoid main(void)\n{\n\tv_pos = a_pos;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}\n"
               ,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pSVar11);
    pSVar3 = local_1b8.m_state;
    if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_1b8.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_1b8.m_ptr = (Shader *)0x0;
        (*(local_1b8.m_state)->_vptr_SharedPtrStateBase[2])(local_1b8.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_1b8.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_1b8.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar12 = (ShaderCompile *)operator_new(0x78);
    local_1c8.m_ptr = vertexShader.m_ptr;
    local_1c8.m_state = vertexShader.m_state;
    if (vertexShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (vertexShader.m_state)->strongRefCount = (vertexShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (vertexShader.m_state)->weakRefCount = (vertexShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderCompile::ShaderCompile
              (pSVar12,&local_1c8,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pSVar12);
    pSVar3 = local_1c8.m_state;
    if (local_1c8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_1c8.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_1c8.m_ptr = (Shader *)0x0;
        (*(local_1c8.m_state)->_vptr_SharedPtrStateBase[2])(local_1c8.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_1c8.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_1c8.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_1c8.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar10 = (CreateShader *)operator_new(0x80);
    GLES2ThreadTest::CreateShader::CreateShader
              (pCVar10,0x8b30,&fragmentShader,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pCVar10);
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar11 = (ShaderSource *)operator_new(0x98);
    local_1d8.m_ptr = fragmentShader.m_ptr;
    local_1d8.m_state = fragmentShader.m_state;
    if (fragmentShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (fragmentShader.m_state)->strongRefCount = (fragmentShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (fragmentShader.m_state)->weakRefCount = (fragmentShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderSource::ShaderSource
              (pSVar11,&local_1d8,
               "varying mediump vec2 v_pos;\nuniform sampler2D u_sampler;\nvoid main(void)\n{\n\tgl_FragColor = texture2D(u_sampler, v_pos);\n}\n"
               ,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pSVar11);
    pSVar3 = local_1d8.m_state;
    if (local_1d8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_1d8.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_1d8.m_ptr = (Shader *)0x0;
        (*(local_1d8.m_state)->_vptr_SharedPtrStateBase[2])(local_1d8.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_1d8.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_1d8.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_1d8.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar12 = (ShaderCompile *)operator_new(0x78);
    local_1e8.m_ptr = fragmentShader.m_ptr;
    local_1e8.m_state = fragmentShader.m_state;
    if (fragmentShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (fragmentShader.m_state)->strongRefCount = (fragmentShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (fragmentShader.m_state)->weakRefCount = (fragmentShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderCompile::ShaderCompile
              (pSVar12,&local_1e8,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pSVar12);
    pSVar3 = local_1e8.m_state;
    if (local_1e8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_1e8.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_1e8.m_ptr = (Shader *)0x0;
        (*(local_1e8.m_state)->_vptr_SharedPtrStateBase[2])(local_1e8.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_1e8.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_1e8.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_1e8.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    this_00 = (CreateProgram *)operator_new(0x78);
    GLES2ThreadTest::CreateProgram::CreateProgram
              (this_00,&program,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)this_00);
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pAVar13 = (AttachShader *)operator_new(0x88);
    local_78.m_ptr = program.m_ptr;
    local_78.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_88.m_ptr = fragmentShader.m_ptr;
    local_88.m_state = fragmentShader.m_state;
    if (fragmentShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (fragmentShader.m_state)->strongRefCount = (fragmentShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (fragmentShader.m_state)->weakRefCount = (fragmentShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::AttachShader::AttachShader
              (pAVar13,&local_78,&local_88,(this->m_config).useFenceSync,(this->m_config).serverSync
              );
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pAVar13);
    pSVar3 = local_88.m_state;
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_88.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_88.m_ptr = (Shader *)0x0;
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_88.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_88.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pSVar3 = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_78.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_78.m_ptr = (Program *)0x0;
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])(local_78.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_78.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_78.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pAVar13 = (AttachShader *)operator_new(0x88);
    local_98.m_ptr = program.m_ptr;
    local_98.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_a8.m_ptr = vertexShader.m_ptr;
    local_a8.m_state = vertexShader.m_state;
    if (vertexShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (vertexShader.m_state)->strongRefCount = (vertexShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (vertexShader.m_state)->weakRefCount = (vertexShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::AttachShader::AttachShader
              (pAVar13,&local_98,&local_a8,(this->m_config).useFenceSync,(this->m_config).serverSync
              );
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pAVar13);
    pSVar3 = local_a8.m_state;
    if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_a8.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_a8.m_ptr = (Shader *)0x0;
        (*(local_a8.m_state)->_vptr_SharedPtrStateBase[2])(local_a8.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_a8.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_a8.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pSVar3 = local_98.m_state;
    if (local_98.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_98.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_98.m_ptr = (Program *)0x0;
        (*(local_98.m_state)->_vptr_SharedPtrStateBase[2])(local_98.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_98.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_98.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_98.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    this_01 = (LinkProgram *)operator_new(0x78);
    local_1f8.m_ptr = program.m_ptr;
    local_1f8.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::LinkProgram::LinkProgram
              (this_01,&local_1f8,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)this_01);
    pSVar3 = local_1f8.m_state;
    if (local_1f8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_1f8.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_1f8.m_ptr = (Program *)0x0;
        (*(local_1f8.m_state)->_vptr_SharedPtrStateBase[2])(local_1f8.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_1f8.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_1f8.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_1f8.m_state = (SharedPtrStateBase *)0x0;
      }
    }
  }
  sourceTexture.m_ptr = (Texture *)0x0;
  sourceTexture.m_state = (SharedPtrStateBase *)0x0;
  texture.m_ptr = (Texture *)0x0;
  texture.m_state = (SharedPtrStateBase *)0x0;
  image.m_ptr = (EGLImage *)0x0;
  image.m_state = (SharedPtrStateBase *)0x0;
  pEVar2 = *(this->m_threads).
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pCVar14 = (CreateTexture *)operator_new(0x78);
  GLES2ThreadTest::CreateTexture::CreateTexture
            (pCVar14,&sourceTexture,(this->m_config).useFenceSync,(this->m_config).serverSync);
  tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pCVar14);
  pEVar2 = *(this->m_threads).
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pTVar15 = (TexImage2D *)operator_new(0x90);
  local_208.m_ptr = sourceTexture.m_ptr;
  local_208.m_state = sourceTexture.m_state;
  if (sourceTexture.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (sourceTexture.m_state)->strongRefCount = (sourceTexture.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (sourceTexture.m_state)->weakRefCount = (sourceTexture.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  GLES2ThreadTest::TexImage2D::TexImage2D
            (pTVar15,&local_208,0,0x1908,0x100,0x100,0x1908,0x1401,(this->m_config).useFenceSync,
             (this->m_config).serverSync);
  tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pTVar15);
  pSVar3 = local_208.m_state;
  if (local_208.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_208.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_208.m_ptr = (Texture *)0x0;
      (*(local_208.m_state)->_vptr_SharedPtrStateBase[2])(local_208.m_state);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_208.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_208.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_208.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  iVar8 = (this->m_config).define;
  if (iVar8 == 1) {
    if (((this->m_config).modify == 0) && ((this->m_config).render != true)) {
      pEVar2 = (this->m_threads).
               super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
               ._M_impl.super__Vector_impl_data._M_start[1];
      pCVar16 = (CreateImageFromTexture *)operator_new(0x88);
      local_c8.m_ptr = sourceTexture.m_ptr;
      local_c8.m_state = sourceTexture.m_state;
      if (sourceTexture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (sourceTexture.m_state)->strongRefCount = (sourceTexture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (sourceTexture.m_state)->weakRefCount = (sourceTexture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::CreateImageFromTexture::CreateImageFromTexture
                (pCVar16,&image,&local_c8,(this->m_config).useFenceSync,(this->m_config).serverSync)
      ;
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pCVar16);
      pSVar3 = local_c8.m_state;
      if (local_c8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_c8.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_c8.m_ptr = (Texture *)0x0;
          (*(local_c8.m_state)->_vptr_SharedPtrStateBase[2])(local_c8.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_c8;
          goto LAB_00dfdd17;
        }
      }
    }
    else {
      pEVar2 = *(this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar16 = (CreateImageFromTexture *)operator_new(0x88);
      local_b8.m_ptr = sourceTexture.m_ptr;
      local_b8.m_state = sourceTexture.m_state;
      if (sourceTexture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (sourceTexture.m_state)->strongRefCount = (sourceTexture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (sourceTexture.m_state)->weakRefCount = (sourceTexture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::CreateImageFromTexture::CreateImageFromTexture
                (pCVar16,&image,&local_b8,(this->m_config).useFenceSync,(this->m_config).serverSync)
      ;
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pCVar16);
      pSVar3 = local_b8.m_state;
      if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_b8.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_b8.m_ptr = (Texture *)0x0;
          (*(local_b8.m_state)->_vptr_SharedPtrStateBase[2])(local_b8.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_b8;
LAB_00dfdd17:
          pSVar3 = pSVar5->m_state;
          if (pSVar3 != (SharedPtrStateBase *)0x0) {
            (*pSVar3->_vptr_SharedPtrStateBase[1])();
          }
          pSVar5->m_state = (SharedPtrStateBase *)0x0;
        }
      }
    }
    iVar8 = (this->m_config).define;
  }
  if (iVar8 == 2) {
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar16 = (CreateImageFromTexture *)operator_new(0x88);
    local_218.m_ptr = sourceTexture.m_ptr;
    local_218.m_state = sourceTexture.m_state;
    if (sourceTexture.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (sourceTexture.m_state)->strongRefCount = (sourceTexture.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (sourceTexture.m_state)->weakRefCount = (sourceTexture.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::CreateImageFromTexture::CreateImageFromTexture
              (pCVar16,&image,&local_218,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pCVar16);
    pSVar3 = local_218.m_state;
    if (local_218.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_218.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_218.m_ptr = (Texture *)0x0;
        (*(local_218.m_state)->_vptr_SharedPtrStateBase[2])(local_218.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_218.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_218.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_218.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar14 = (CreateTexture *)operator_new(0x78);
    GLES2ThreadTest::CreateTexture::CreateTexture
              (pCVar14,&texture,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pCVar14);
    if (((this->m_config).modify == 0) && ((this->m_config).render != true)) {
      pEVar2 = (this->m_threads).
               super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
               ._M_impl.super__Vector_impl_data._M_start[1];
      pDVar17 = (DefineTextureFromImage *)operator_new(0x88);
      local_48.m_ptr = texture.m_ptr;
      local_48.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      local_e8.m_ptr = image.m_ptr;
      local_e8.m_state = image.m_state;
      if (image.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (image.m_state)->strongRefCount = (image.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (image.m_state)->weakRefCount = (image.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::DefineTextureFromImage::DefineTextureFromImage
                (pDVar17,&local_48,&local_e8,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar17);
      pSVar3 = local_e8.m_state;
      if (local_e8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_e8.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_e8.m_ptr = (EGLImage *)0x0;
          (*(local_e8.m_state)->_vptr_SharedPtrStateBase[2])(local_e8.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_e8.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_e8.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_e8.m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pSVar3 = local_48.m_state;
      if (local_48.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_48.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_48.m_ptr = (Texture *)0x0;
          (*(local_48.m_state)->_vptr_SharedPtrStateBase[2])(local_48.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_48;
          goto LAB_00dfdf97;
        }
      }
    }
    else {
      pEVar2 = *(this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pDVar17 = (DefineTextureFromImage *)operator_new(0x88);
      local_38.m_ptr = texture.m_ptr;
      local_38.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      local_d8.m_ptr = image.m_ptr;
      local_d8.m_state = image.m_state;
      if (image.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (image.m_state)->strongRefCount = (image.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (image.m_state)->weakRefCount = (image.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::DefineTextureFromImage::DefineTextureFromImage
                (pDVar17,&local_38,&local_d8,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar17);
      pSVar3 = local_d8.m_state;
      if (local_d8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_d8.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_d8.m_ptr = (EGLImage *)0x0;
          (*(local_d8.m_state)->_vptr_SharedPtrStateBase[2])(local_d8.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_d8.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_d8.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_d8.m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pSVar3 = local_38.m_state;
      if (local_38.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_38.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_38.m_ptr = (Texture *)0x0;
          (*(local_38.m_state)->_vptr_SharedPtrStateBase[2])(local_38.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_38;
LAB_00dfdf97:
          pSVar3 = pSVar5->m_state;
          if (pSVar3 != (SharedPtrStateBase *)0x0) {
            (*pSVar3->_vptr_SharedPtrStateBase[1])();
          }
          pSVar5->m_state = (SharedPtrStateBase *)0x0;
        }
      }
    }
  }
  pEVar2 = *(this->m_threads).
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pDVar18 = (DeleteTexture *)operator_new(0x78);
  local_228.m_ptr = sourceTexture.m_ptr;
  local_228.m_state = sourceTexture.m_state;
  if (sourceTexture.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (sourceTexture.m_state)->strongRefCount = (sourceTexture.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (sourceTexture.m_state)->weakRefCount = (sourceTexture.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  GLES2ThreadTest::DeleteTexture::DeleteTexture
            (pDVar18,&local_228,(this->m_config).useFenceSync,(this->m_config).serverSync);
  tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar18);
  pSVar3 = local_228.m_state;
  if (local_228.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_228.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_228.m_ptr = (Texture *)0x0;
      (*(local_228.m_state)->_vptr_SharedPtrStateBase[2])(local_228.m_state);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_228.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_228.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_228.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  iVar8 = (this->m_config).modify;
  if (iVar8 == 1) {
    ppEVar4 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_config).render == true) {
      pEVar2 = *ppEVar4;
      pTVar19 = (TexSubImage2D *)operator_new(0x98);
      local_f8.m_ptr = texture.m_ptr;
      local_f8.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::TexSubImage2D::TexSubImage2D
                (pTVar19,&local_f8,0,0x11,0x11,0x1d,0x1d,0x1908,0x1401,(this->m_config).useFenceSync
                 ,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pTVar19);
      pSVar3 = local_f8.m_state;
      if (local_f8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_f8.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_f8.m_ptr = (Texture *)0x0;
          (*(local_f8.m_state)->_vptr_SharedPtrStateBase[2])(local_f8.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_f8;
LAB_00dfe244:
          pSVar3 = pSVar5->m_state;
          if (pSVar3 != (SharedPtrStateBase *)0x0) {
            (*pSVar3->_vptr_SharedPtrStateBase[1])();
          }
          pSVar5->m_state = (SharedPtrStateBase *)0x0;
        }
      }
    }
    else {
      pEVar2 = ppEVar4[1];
      pTVar19 = (TexSubImage2D *)operator_new(0x98);
      local_108.m_ptr = texture.m_ptr;
      local_108.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::TexSubImage2D::TexSubImage2D
                (pTVar19,&local_108,0,0x11,0x11,0x1d,0x1d,0x1908,0x1401,
                 (this->m_config).useFenceSync,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pTVar19);
      pSVar3 = local_108.m_state;
      if (local_108.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_108.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_108.m_ptr = (Texture *)0x0;
          (*(local_108.m_state)->_vptr_SharedPtrStateBase[2])(local_108.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_108;
          goto LAB_00dfe244;
        }
      }
    }
    iVar8 = (this->m_config).modify;
  }
  if (iVar8 == 2) {
    ppEVar4 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_config).render == true) {
      pEVar2 = *ppEVar4;
      pCVar20 = (CopyTexSubImage2D *)operator_new(0x98);
      local_118.m_ptr = texture.m_ptr;
      local_118.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::CopyTexSubImage2D::CopyTexSubImage2D
                (pCVar20,&local_118,0,7,7,0x11,0x11,0x1d,0x1d,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pCVar20);
      pSVar3 = local_118.m_state;
      if (local_118.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_118.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_118.m_ptr = (Texture *)0x0;
          (*(local_118.m_state)->_vptr_SharedPtrStateBase[2])(local_118.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_118;
LAB_00dfe42c:
          pSVar3 = pSVar5->m_state;
          if (pSVar3 != (SharedPtrStateBase *)0x0) {
            (*pSVar3->_vptr_SharedPtrStateBase[1])();
          }
          pSVar5->m_state = (SharedPtrStateBase *)0x0;
        }
      }
    }
    else {
      pEVar2 = ppEVar4[1];
      pCVar20 = (CopyTexSubImage2D *)operator_new(0x98);
      local_128.m_ptr = texture.m_ptr;
      local_128.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::CopyTexSubImage2D::CopyTexSubImage2D
                (pCVar20,&local_128,0,7,7,0x11,0x11,0x1d,0x1d,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pCVar20);
      pSVar3 = local_128.m_state;
      if (local_128.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_128.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_128.m_ptr = (Texture *)0x0;
          (*(local_128.m_state)->_vptr_SharedPtrStateBase[2])(local_128.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_128;
          goto LAB_00dfe42c;
        }
      }
    }
  }
  iVar8 = (this->m_config).modify;
  if (iVar8 == 3) {
    ppEVar4 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_config).render == true) {
      pEVar2 = *ppEVar4;
      pTVar15 = (TexImage2D *)operator_new(0x90);
      local_138.m_ptr = texture.m_ptr;
      local_138.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::TexImage2D::TexImage2D
                (pTVar15,&local_138,0,0x1908,0x100,0x100,0x1908,0x1401,(this->m_config).useFenceSync
                 ,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pTVar15);
      pSVar3 = local_138.m_state;
      if (local_138.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_138.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_138.m_ptr = (Texture *)0x0;
          (*(local_138.m_state)->_vptr_SharedPtrStateBase[2])(local_138.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_138;
LAB_00dfe608:
          pSVar3 = pSVar5->m_state;
          if (pSVar3 != (SharedPtrStateBase *)0x0) {
            (*pSVar3->_vptr_SharedPtrStateBase[1])();
          }
          pSVar5->m_state = (SharedPtrStateBase *)0x0;
        }
      }
    }
    else {
      pEVar2 = ppEVar4[1];
      pTVar15 = (TexImage2D *)operator_new(0x90);
      local_148.m_ptr = texture.m_ptr;
      local_148.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::TexImage2D::TexImage2D
                (pTVar15,&local_148,0,0x1908,0x100,0x100,0x1908,0x1401,(this->m_config).useFenceSync
                 ,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pTVar15);
      pSVar3 = local_148.m_state;
      if (local_148.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_148.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_148.m_ptr = (Texture *)0x0;
          (*(local_148.m_state)->_vptr_SharedPtrStateBase[2])(local_148.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_148;
          goto LAB_00dfe608;
        }
      }
    }
    iVar8 = (this->m_config).modify;
  }
  if (iVar8 == 4) {
    ppEVar4 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_config).render == true) {
      pEVar2 = *ppEVar4;
      pCVar21 = (CopyTexImage2D *)operator_new(0x98);
      local_158.m_ptr = texture.m_ptr;
      local_158.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::CopyTexImage2D::CopyTexImage2D
                (pCVar21,&local_158,0,0x1908,7,7,0x100,0x100,0,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pCVar21);
      pSVar3 = local_158.m_state;
      if (local_158.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_158.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_158.m_ptr = (Texture *)0x0;
          (*(local_158.m_state)->_vptr_SharedPtrStateBase[2])(local_158.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_158;
LAB_00dfe7f0:
          pSVar3 = pSVar5->m_state;
          if (pSVar3 != (SharedPtrStateBase *)0x0) {
            (*pSVar3->_vptr_SharedPtrStateBase[1])();
          }
          pSVar5->m_state = (SharedPtrStateBase *)0x0;
        }
      }
    }
    else {
      pEVar2 = ppEVar4[1];
      pCVar21 = (CopyTexImage2D *)operator_new(0x98);
      local_168.m_ptr = texture.m_ptr;
      local_168.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::CopyTexImage2D::CopyTexImage2D
                (pCVar21,&local_168,0,0x1908,7,7,0x100,0x100,0,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pCVar21);
      pSVar3 = local_168.m_state;
      if (local_168.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_168.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_168.m_ptr = (Texture *)0x0;
          (*(local_168.m_state)->_vptr_SharedPtrStateBase[2])(local_168.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_168;
          goto LAB_00dfe7f0;
        }
      }
    }
  }
  if ((this->m_config).render == true) {
    pixels1.m_ptr = (DataBlock *)0x0;
    pixels1.m_state = (SharedPtrStateBase *)0x0;
    pixels2.m_ptr = (DataBlock *)0x0;
    pixels2.m_state = (SharedPtrStateBase *)0x0;
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar22 = (RenderTexture *)operator_new(0x88);
    local_178.m_ptr = program.m_ptr;
    local_178.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_188.m_ptr = texture.m_ptr;
    local_188.m_state = texture.m_state;
    if (texture.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::RenderTexture::RenderTexture
              (pRVar22,&local_178,&local_188,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pRVar22);
    pSVar3 = local_188.m_state;
    if (local_188.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_188.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_188.m_ptr = (Texture *)0x0;
        (*(local_188.m_state)->_vptr_SharedPtrStateBase[2])(local_188.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_188.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_188.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_188.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pSVar3 = local_178.m_state;
    if (local_178.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_178.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_178.m_ptr = (Program *)0x0;
        (*(local_178.m_state)->_vptr_SharedPtrStateBase[2])(local_178.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_178.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_178.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_178.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pEVar2 = (this->m_threads).
             super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
             ._M_impl.super__Vector_impl_data._M_start[1];
    pRVar22 = (RenderTexture *)operator_new(0x88);
    local_198.m_ptr = program.m_ptr;
    local_198.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_1a8.m_ptr = texture.m_ptr;
    local_1a8.m_state = texture.m_state;
    if (texture.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::RenderTexture::RenderTexture
              (pRVar22,&local_198,&local_1a8,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pRVar22);
    pSVar3 = local_1a8.m_state;
    if (local_1a8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_1a8.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_1a8.m_ptr = (Texture *)0x0;
        (*(local_1a8.m_state)->_vptr_SharedPtrStateBase[2])(local_1a8.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_1a8.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_1a8.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_1a8.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pSVar3 = local_198.m_state;
    if (local_198.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_198.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_198.m_ptr = (Program *)0x0;
        (*(local_198.m_state)->_vptr_SharedPtrStateBase[2])(local_198.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_198.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_198.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_198.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar23 = (ReadPixels *)operator_new(0x90);
    GLES2ThreadTest::ReadPixels::ReadPixels
              (pRVar23,0,0,400,400,0x1908,0x1401,&pixels1,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pRVar23);
    pEVar2 = (this->m_threads).
             super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
             ._M_impl.super__Vector_impl_data._M_start[1];
    pRVar23 = (ReadPixels *)operator_new(0x90);
    GLES2ThreadTest::ReadPixels::ReadPixels
              (pRVar23,0,0,400,400,0x1908,0x1401,&pixels2,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pRVar23);
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    this_02 = (CompareData *)operator_new(0x58);
    local_238.m_ptr = pixels1.m_ptr;
    local_238.m_state = pixels1.m_state;
    if (pixels1.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (pixels1.m_state)->strongRefCount = (pixels1.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (pixels1.m_state)->weakRefCount = (pixels1.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_248.m_ptr = pixels2.m_ptr;
    local_248.m_state = pixels2.m_state;
    if (pixels2.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (pixels2.m_state)->strongRefCount = (pixels2.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (pixels2.m_state)->weakRefCount = (pixels2.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    tcu::ThreadUtil::CompareData::CompareData(this_02,&local_238,&local_248);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)this_02);
    if (local_248.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_248.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_248.m_ptr = (DataBlock *)0x0;
        (*(local_248.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_248.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_248.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_248.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_248.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    if (local_238.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_238.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_238.m_ptr = (DataBlock *)0x0;
        (*(local_238.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_238.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_238.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_238.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_238.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pSVar3 = pixels2.m_state;
    if (pixels2.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(pixels2.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pixels2.m_ptr = (DataBlock *)0x0;
        (*(pixels2.m_state)->_vptr_SharedPtrStateBase[2])(pixels2.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (pixels2.m_state != (SharedPtrStateBase *)0x0)) {
        (*(pixels2.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pSVar3 = pixels1.m_state;
    if (pixels1.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(pixels1.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pixels1.m_ptr = (DataBlock *)0x0;
        (*(pixels1.m_state)->_vptr_SharedPtrStateBase[2])(pixels1.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (pixels1.m_state != (SharedPtrStateBase *)0x0)) {
        (*(pixels1.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
  }
  pTVar7 = texture.m_ptr;
  if (texture.m_ptr != (Texture *)0x0) {
    if (((this->m_config).modify == 0) && ((this->m_config).render != true)) {
      pEVar2 = (this->m_threads).
               super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
               ._M_impl.super__Vector_impl_data._M_start[1];
      pDVar18 = (DeleteTexture *)operator_new(0x78);
      local_268.m_ptr = pTVar7;
      local_268.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::DeleteTexture::DeleteTexture
                (pDVar18,&local_268,(this->m_config).useFenceSync,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar18);
      if (local_268.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_268.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_268.m_ptr = (Texture *)0x0;
          (*(local_268.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_268.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_268;
          goto LAB_00dfee5e;
        }
      }
    }
    else {
      pEVar2 = *(this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pDVar18 = (DeleteTexture *)operator_new(0x78);
      local_258.m_ptr = pTVar7;
      local_258.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::DeleteTexture::DeleteTexture
                (pDVar18,&local_258,(this->m_config).useFenceSync,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar18);
      if (local_258.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_258.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_258.m_ptr = (Texture *)0x0;
          (*(local_258.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_258.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_258;
LAB_00dfee5e:
          pSVar3 = pSVar5->m_state;
          if (pSVar3 != (SharedPtrStateBase *)0x0) {
            (*pSVar3->_vptr_SharedPtrStateBase[1])();
          }
          pSVar5->m_state = (SharedPtrStateBase *)0x0;
        }
      }
    }
  }
  if (((this->m_config).modify == 0) && ((this->m_config).render != true)) {
    pEVar2 = (this->m_threads).
             super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
             ._M_impl.super__Vector_impl_data._M_start[1];
    pDVar24 = (DestroyImage *)operator_new(0x78);
    local_288.m_ptr = image.m_ptr;
    local_288.m_state = image.m_state;
    if (image.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (image.m_state)->strongRefCount = (image.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (image.m_state)->weakRefCount = (image.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DestroyImage::DestroyImage
              (pDVar24,&local_288,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar24);
    if (local_288.m_state == (SharedPtrStateBase *)0x0) goto LAB_00dfef50;
    LOCK();
    pdVar1 = &(local_288.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_288.m_ptr = (EGLImage *)0x0;
      (*(local_288.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_288.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 != 0) goto LAB_00dfef50;
    pSVar6 = &local_288;
  }
  else {
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar24 = (DestroyImage *)operator_new(0x78);
    local_278.m_ptr = image.m_ptr;
    local_278.m_state = image.m_state;
    if (image.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (image.m_state)->strongRefCount = (image.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (image.m_state)->weakRefCount = (image.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DestroyImage::DestroyImage
              (pDVar24,&local_278,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar24);
    if (local_278.m_state == (SharedPtrStateBase *)0x0) goto LAB_00dfef50;
    LOCK();
    pdVar1 = &(local_278.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_278.m_ptr = (EGLImage *)0x0;
      (*(local_278.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_278.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 != 0) goto LAB_00dfef50;
    pSVar6 = &local_278;
  }
  pSVar3 = pSVar6->m_state;
  if (pSVar3 != (SharedPtrStateBase *)0x0) {
    (*pSVar3->_vptr_SharedPtrStateBase[1])();
  }
  pSVar6->m_state = (SharedPtrStateBase *)0x0;
LAB_00dfef50:
  if ((this->m_config).render == true) {
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar25 = (DeleteShader *)operator_new(0x78);
    local_298.m_ptr = vertexShader.m_ptr;
    local_298.m_state = vertexShader.m_state;
    if (vertexShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (vertexShader.m_state)->strongRefCount = (vertexShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (vertexShader.m_state)->weakRefCount = (vertexShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DeleteShader::DeleteShader
              (pDVar25,&local_298,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar25);
    if (local_298.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_298.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_298.m_ptr = (Shader *)0x0;
        (*(local_298.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_298.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_298.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_298.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_298.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar25 = (DeleteShader *)operator_new(0x78);
    local_2a8.m_ptr = fragmentShader.m_ptr;
    local_2a8.m_state = fragmentShader.m_state;
    if (fragmentShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (fragmentShader.m_state)->strongRefCount = (fragmentShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (fragmentShader.m_state)->weakRefCount = (fragmentShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DeleteShader::DeleteShader
              (pDVar25,&local_2a8,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar25);
    if (local_2a8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_2a8.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_2a8.m_ptr = (Shader *)0x0;
        (*(local_2a8.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_2a8.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_2a8.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_2a8.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_2a8.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    this_03 = (DeleteProgram *)operator_new(0x78);
    local_2b8.m_ptr = program.m_ptr;
    local_2b8.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DeleteProgram::DeleteProgram
              (this_03,&local_2b8,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)this_03);
    if (local_2b8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_2b8.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_2b8.m_ptr = (Program *)0x0;
        (*(local_2b8.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_2b8.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_2b8.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_2b8.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_2b8.m_state = (SharedPtrStateBase *)0x0;
      }
    }
  }
  pSVar3 = image.m_state;
  if (image.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(image.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      image.m_ptr = (EGLImage *)0x0;
      (*(image.m_state)->_vptr_SharedPtrStateBase[2])(image.m_state);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (image.m_state != (SharedPtrStateBase *)0x0)) {
      (*(image.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar3 = texture.m_state;
  if (texture.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(texture.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      texture.m_ptr = (Texture *)0x0;
      (*(texture.m_state)->_vptr_SharedPtrStateBase[2])(texture.m_state);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (texture.m_state != (SharedPtrStateBase *)0x0)) {
      (*(texture.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar3 = sourceTexture.m_state;
  if (sourceTexture.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(sourceTexture.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      sourceTexture.m_ptr = (Texture *)0x0;
      (*(sourceTexture.m_state)->_vptr_SharedPtrStateBase[2])(sourceTexture.m_state);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (sourceTexture.m_state != (SharedPtrStateBase *)0x0)) {
      (*(sourceTexture.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar3 = program.m_state;
  if (program.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(program.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      program.m_ptr = (Program *)0x0;
      (*(program.m_state)->_vptr_SharedPtrStateBase[2])(program.m_state);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (program.m_state != (SharedPtrStateBase *)0x0)) {
      (*(program.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar3 = fragmentShader.m_state;
  if (fragmentShader.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(fragmentShader.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      fragmentShader.m_ptr = (Shader *)0x0;
      (*(fragmentShader.m_state)->_vptr_SharedPtrStateBase[2])(fragmentShader.m_state);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (fragmentShader.m_state != (SharedPtrStateBase *)0x0)) {
      (*(fragmentShader.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar3 = vertexShader.m_state;
  if (vertexShader.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(vertexShader.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      vertexShader.m_ptr = (Shader *)0x0;
      (*(vertexShader.m_state)->_vptr_SharedPtrStateBase[2])(vertexShader.m_state);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (vertexShader.m_state != (SharedPtrStateBase *)0x0)) {
      (*(vertexShader.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

void GLES2ThreadedSharingTest::addImageOperations (void)
{
	// Add operations for verify
	SharedPtr<GLES2ThreadTest::Shader>	vertexShader;
	SharedPtr<GLES2ThreadTest::Shader>	fragmentShader;
	SharedPtr<GLES2ThreadTest::Program>	program;

	m_threads[0]->addOperation(new GLES2ThreadTest::InitGLExtension("GL_OES_EGL_image"));
	m_threads[1]->addOperation(new GLES2ThreadTest::InitGLExtension("GL_OES_EGL_image"));

	if (m_config.render)
	{
		const char* vertexShaderSource =
		"attribute highp vec2 a_pos;\n"
		"varying mediump vec2 v_pos;\n"
		"void main(void)\n"
		"{\n"
		"\tv_pos = a_pos;\n"
		"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
		"}\n";

		const char* fragmentShaderSource =
		"varying mediump vec2 v_pos;\n"
		"uniform sampler2D u_sampler;\n"
		"void main(void)\n"
		"{\n"
		"\tgl_FragColor = texture2D(u_sampler, v_pos);\n"
		"}\n";

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateShader(GL_VERTEX_SHADER, vertexShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderSource(vertexShader, vertexShaderSource, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderCompile(vertexShader, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateShader(GL_FRAGMENT_SHADER, fragmentShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderSource(fragmentShader, fragmentShaderSource, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderCompile(fragmentShader, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateProgram(program, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::AttachShader(program, fragmentShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::AttachShader(program, vertexShader, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::LinkProgram(program, m_config.useFenceSync, m_config.serverSync));
	}

	SharedPtr<GLES2ThreadTest::Texture>		sourceTexture;
	SharedPtr<GLES2ThreadTest::Texture>		texture;
	SharedPtr<GLES2ThreadTest::EGLImage>	image;

	m_threads[0]->addOperation(new GLES2ThreadTest::CreateTexture(sourceTexture, m_config.useFenceSync, m_config.serverSync));
	m_threads[0]->addOperation(new GLES2ThreadTest::TexImage2D(sourceTexture, 0, GL_RGBA, 256, 256, GL_RGBA, GL_UNSIGNED_BYTE, m_config.useFenceSync, m_config.serverSync));

	if (m_config.define == 1)
	{
		if (m_config.modify || m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::CreateImageFromTexture(image, sourceTexture, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::CreateImageFromTexture(image, sourceTexture, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.define == 2)
	{
		m_threads[0]->addOperation(new GLES2ThreadTest::CreateImageFromTexture(image, sourceTexture, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::CreateTexture(texture, m_config.useFenceSync, m_config.serverSync));

		if (m_config.modify || m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::DefineTextureFromImage(texture, image, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::DefineTextureFromImage(texture, image, m_config.useFenceSync, m_config.serverSync));
	}

	m_threads[0]->addOperation(new GLES2ThreadTest::DeleteTexture(sourceTexture, m_config.useFenceSync, m_config.serverSync));

	if (m_config.modify == 1)
	{
		DE_ASSERT(m_config.define != 1);

		if (m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::TexSubImage2D(texture, 0, 17, 17, 29, 29, GL_RGBA, GL_UNSIGNED_BYTE, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::TexSubImage2D(texture, 0, 17, 17, 29, 29, GL_RGBA, GL_UNSIGNED_BYTE, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.modify == 2)
	{
		DE_ASSERT(m_config.define != 1);

		if (m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::CopyTexSubImage2D(texture, 0, 7, 7, 17, 17, 29, 29, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::CopyTexSubImage2D(texture, 0, 7, 7, 17, 17, 29, 29, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.modify == 3)
	{
		DE_ASSERT(m_config.define != 1);

		if (m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::TexImage2D(texture, 0, GL_RGBA, 256, 256, GL_RGBA, GL_UNSIGNED_BYTE, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::TexImage2D(texture, 0, GL_RGBA, 256, 256, GL_RGBA, GL_UNSIGNED_BYTE, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.modify == 4)
	{
		DE_ASSERT(m_config.define != 1);

		if (m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::CopyTexImage2D(texture, 0, GL_RGBA, 7, 7, 256, 256, 0, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::CopyTexImage2D(texture, 0, GL_RGBA, 7, 7, 256, 256, 0, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.render)
	{
		DE_ASSERT(m_config.define != 1);

		SharedPtr<tcu::ThreadUtil::DataBlock> pixels1;
		SharedPtr<tcu::ThreadUtil::DataBlock> pixels2;

		m_threads[0]->addOperation(new GLES2ThreadTest::RenderTexture(program, texture, m_config.useFenceSync, m_config.serverSync));
		m_threads[1]->addOperation(new GLES2ThreadTest::RenderTexture(program, texture, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::ReadPixels(0, 0, 400, 400, GL_RGBA, GL_UNSIGNED_BYTE, pixels1, m_config.useFenceSync, m_config.serverSync));
		m_threads[1]->addOperation(new GLES2ThreadTest::ReadPixels(0, 0, 400, 400, GL_RGBA, GL_UNSIGNED_BYTE, pixels2, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new tcu::ThreadUtil::CompareData(pixels1, pixels2));
	}

	if (texture)
	{
		if (m_config.modify || m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::DeleteTexture(texture, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::DeleteTexture(texture, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.modify || m_config.render)
		m_threads[0]->addOperation(new GLES2ThreadTest::DestroyImage(image, m_config.useFenceSync, m_config.serverSync));
	else
		m_threads[1]->addOperation(new GLES2ThreadTest::DestroyImage(image, m_config.useFenceSync, m_config.serverSync));

	if (m_config.render)
	{
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteShader(vertexShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteShader(fragmentShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteProgram(program, m_config.useFenceSync, m_config.serverSync));
	}
}